

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

scalar __thiscall
absl::make_unique<S2ClosestEdgeQuery,S2ShapeIndex_const*&>(absl *this,S2ShapeIndex **args)

{
  S2ShapeIndex *pSVar1;
  double *pdVar2;
  S1ChordAngle local_30;
  double local_28;
  double local_20;
  
  pdVar2 = (double *)operator_new(0x2f8);
  pSVar1 = *args;
  S1ChordAngle::S1ChordAngle(&local_30,INFINITY);
  local_20 = local_30.length2_;
  S1ChordAngle::S1ChordAngle(&local_30,0.0);
  local_28 = local_30.length2_;
  S1ChordAngle::S1ChordAngle(&local_30,INFINITY);
  *pdVar2 = local_30.length2_;
  S1ChordAngle::S1ChordAngle(&local_30,0.0);
  pdVar2[1] = local_30.length2_;
  *(undefined4 *)(pdVar2 + 2) = 0x7fffffff;
  *(undefined2 *)((long)pdVar2 + 0x14) = 1;
  S2ClosestEdgeQueryBase<S2MinDistance>::S2ClosestEdgeQueryBase
            ((S2ClosestEdgeQueryBase<S2MinDistance> *)(pdVar2 + 3));
  *pdVar2 = local_20;
  pdVar2[1] = local_28;
  *(undefined4 *)(pdVar2 + 2) = 0x7fffffff;
  *(undefined2 *)((long)pdVar2 + 0x14) = 1;
  pdVar2[3] = (double)pSVar1;
  pdVar2[0x11] = 0.0;
  if (pdVar2[8] != pdVar2[7]) {
    pdVar2[8] = pdVar2[7];
  }
  InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::clear
            ((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
              *)(pdVar2 + 10));
  *(double **)this = pdVar2;
  return (__uniq_ptr_data<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>,_true,_true>)
         (__uniq_ptr_data<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>,_true,_true>)
         this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}